

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

bool c4::yml::anon_unknown_0::_is_doc_sep(csubstr s)

{
  int iVar1;
  long lVar2;
  ulong in_RSI;
  long in_RDI;
  basic_substring<const_char> local_30;
  basic_substring<const_char> local_20;
  
  if (in_RSI < 3) {
    return false;
  }
  lVar2 = 0;
  do {
    if (*(char *)(in_RDI + lVar2) != "---"[lVar2]) {
      lVar2 = 0;
      do {
        if (*(char *)(in_RDI + lVar2) != "\t..."[lVar2 + 1]) {
          return false;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      iVar1 = basic_substring<const_char>::compare(&local_20,"...",3);
      if (iVar1 == 0) {
        return true;
      }
      basic_substring<const_char>::basic_substring(&local_30,(char *)(in_RDI + 3),in_RSI - 3);
      goto LAB_0022bddd;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  iVar1 = basic_substring<const_char>::compare(&local_20,"---",3);
  if (iVar1 == 0) {
    return true;
  }
  basic_substring<const_char>::basic_substring(&local_30,(char *)(in_RDI + 3),in_RSI - 3);
LAB_0022bddd:
  if (local_30.len == 0) {
    return false;
  }
  return *local_30.str == '\t' || *local_30.str == ' ';
}

Assistant:

bool _is_doc_sep(csubstr s)
{
    constexpr const csubstr dashes = "---";
    constexpr const csubstr ellipsis = "...";
    constexpr const csubstr whitesp = " \t";
    if(s.begins_with(dashes))
        return s == dashes || s.sub(3).begins_with_any(whitesp);
    else if(s.begins_with(ellipsis))
        return s == ellipsis || s.sub(3).begins_with_any(whitesp);
    return false;
}